

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float32 float32_rem_aarch64(float32 a,float32 b,float_status *status)

{
  byte bVar1;
  float32 fVar2;
  float32 b_00;
  uint64_t uVar3;
  ulong uVar4;
  uint uVar5;
  uint zExp;
  byte bVar6;
  float_status *status_00;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ulong a0;
  uint uVar10;
  
  status_00 = (float_status *)(ulong)b;
  fVar2 = float32_squash_input_denormal_aarch64(a,status);
  b_00 = float32_squash_input_denormal_aarch64(b,status);
  uVar9 = fVar2 & 0x7fffff;
  uVar7 = fVar2 >> 0x17 & 0xff;
  uVar10 = b_00 & 0x7fffff;
  uVar5 = b_00 >> 0x17;
  zExp = uVar5 & 0xff;
  if (uVar7 == 0xff) {
    if ((uVar9 == 0) && (uVar10 == 0 || zExp != 0xff)) {
LAB_00581ea3:
      status->float_exception_flags = status->float_exception_flags | 1;
      fVar2 = float32_default_nan_aarch64(status_00);
      return fVar2;
    }
LAB_00581dde:
    fVar2 = propagateFloat32NaN(fVar2,b_00,status);
    return fVar2;
  }
  if ((char)uVar5 == '\0') {
    if (uVar10 == 0) goto LAB_00581ea3;
    uVar5 = 0x1f;
    if (uVar10 != 0) {
      for (; uVar10 >> uVar5 == 0; uVar5 = uVar5 - 1) {
      }
    }
    uVar10 = uVar10 << ((char)(uVar5 ^ 0x1f) - 8U & 0x1f);
    zExp = 9 - (uVar5 ^ 0x1f);
  }
  else if ((uVar5 & 0xff) == 0xff) {
    if (uVar10 == 0) {
      return fVar2;
    }
    goto LAB_00581dde;
  }
  if (uVar7 == 0) {
    if (uVar9 == 0) {
      return fVar2;
    }
    uVar5 = 0x1f;
    if (uVar9 != 0) {
      for (; uVar9 >> uVar5 == 0; uVar5 = uVar5 - 1) {
      }
    }
    uVar9 = uVar9 << ((char)(uVar5 ^ 0x1f) - 8U & 0x1f);
    uVar7 = 9 - (uVar5 ^ 0x1f);
  }
  iVar8 = uVar7 - zExp;
  uVar9 = uVar9 | 0x800000;
  uVar10 = uVar10 | 0x800000;
  if (iVar8 < 0x20) {
    uVar9 = uVar9 << 8;
    if (iVar8 < 0) {
      if (iVar8 != -1) {
        return fVar2;
      }
      uVar9 = uVar9 >> 1;
    }
    uVar10 = uVar10 << 8;
    uVar5 = 0;
    if (uVar10 <= uVar9) {
      uVar5 = uVar10;
    }
    uVar5 = uVar9 - uVar5;
    if (iVar8 < 1) {
      uVar7 = (uint)(uVar10 <= uVar9);
      uVar5 = uVar5 >> 2;
      uVar10 = uVar10 >> 2;
    }
    else {
      uVar7 = SUB164((ZEXT416(uVar5) << 0x20) / ZEXT416(uVar10),0) >> (-(char)iVar8 & 0x1fU);
      uVar10 = uVar10 >> 2;
      uVar5 = ((uVar5 >> 1) << ((char)iVar8 - 1U & 0x1f)) - uVar7 * uVar10;
    }
  }
  else {
    uVar5 = uVar10;
    if (uVar9 < uVar10) {
      uVar5 = 0;
    }
    a0 = (ulong)(uVar9 - uVar5) << 0x28;
    iVar8 = iVar8 + -0x40;
    while( true ) {
      uVar3 = estimateDiv128To64(a0,0,(ulong)uVar10 << 0x28);
      uVar4 = uVar3 - 2;
      if (uVar3 < 2) {
        uVar4 = 0;
      }
      if (iVar8 < 1) break;
      a0 = uVar4 * -((ulong)uVar10 << 0x26);
      iVar8 = iVar8 + -0x3e;
    }
    uVar10 = uVar10 * 0x40;
    uVar7 = (uint)(uVar4 >> (-(char)iVar8 & 0x3fU));
    uVar5 = (int)((a0 >> 0x21) << ((char)iVar8 + 0x3fU & 0x3f)) - uVar10 * uVar7;
  }
  uVar9 = uVar5 * -2;
  uVar7 = uVar7 - 1;
  do {
    uVar9 = uVar9 + uVar10 * 2;
    uVar7 = uVar7 + 1;
    uVar5 = uVar5 - uVar10;
  } while (-1 < (int)uVar5);
  if (((int)(uVar10 - uVar9) < 0) || ((bVar1 = 1, uVar10 == uVar9 && ((uVar7 & 1) == 0)))) {
    uVar5 = uVar10 + uVar5;
    bVar1 = (byte)(uVar5 >> 0x18);
    bVar6 = bVar1 >> 7;
    bVar1 = bVar1 >> 7;
    if (-1 < (int)uVar5) goto LAB_00581fb0;
  }
  bVar6 = bVar1;
  uVar5 = -uVar5;
LAB_00581fb0:
  fVar2 = normalizeRoundAndPackFloat32(bVar6 ^ (byte)(fVar2 >> 0x1f),zExp,uVar5,status);
  return fVar2;
}

Assistant:

float32 float32_rem(float32 a, float32 b, float_status *status)
{
    flag aSign, zSign;
    int aExp, bExp, expDiff;
    uint32_t aSig, bSig;
    uint32_t q;
    uint64_t aSig64, bSig64, q64;
    uint32_t alternateASig;
    int32_t sigMean;
    a = float32_squash_input_denormal(a, status);
    b = float32_squash_input_denormal(b, status);

    aSig = extractFloat32Frac( a );
    aExp = extractFloat32Exp( a );
    aSign = extractFloat32Sign( a );
    bSig = extractFloat32Frac( b );
    bExp = extractFloat32Exp( b );
    if ( aExp == 0xFF ) {
        if ( aSig || ( ( bExp == 0xFF ) && bSig ) ) {
            return propagateFloat32NaN(a, b, status);
        }
        float_raise(float_flag_invalid, status);
        return float32_default_nan(status);
    }
    if ( bExp == 0xFF ) {
        if (bSig) {
            return propagateFloat32NaN(a, b, status);
        }
        return a;
    }
    if ( bExp == 0 ) {
        if ( bSig == 0 ) {
            float_raise(float_flag_invalid, status);
            return float32_default_nan(status);
        }
        normalizeFloat32Subnormal( bSig, &bExp, &bSig );
    }
    if ( aExp == 0 ) {
        if ( aSig == 0 ) return a;
        normalizeFloat32Subnormal( aSig, &aExp, &aSig );
    }
    expDiff = aExp - bExp;
    aSig |= 0x00800000;
    bSig |= 0x00800000;
    if ( expDiff < 32 ) {
        aSig <<= 8;
        bSig <<= 8;
        if ( expDiff < 0 ) {
            if ( expDiff < -1 ) return a;
            aSig >>= 1;
        }
        q = ( bSig <= aSig );
        if ( q ) aSig -= bSig;
        if ( 0 < expDiff ) {
            q = ( ( (uint64_t) aSig )<<32 ) / bSig;
            q >>= 32 - expDiff;
            bSig >>= 2;
            aSig = ( ( aSig>>1 )<<( expDiff - 1 ) ) - bSig * q;
        }
        else {
            aSig >>= 2;
            bSig >>= 2;
        }
    }
    else {
        if ( bSig <= aSig ) aSig -= bSig;
        aSig64 = ( (uint64_t) aSig )<<40;
        bSig64 = ( (uint64_t) bSig )<<40;
        expDiff -= 64;
        while ( 0 < expDiff ) {
            q64 = estimateDiv128To64( aSig64, 0, bSig64 );
            q64 = ( 2 < q64 ) ? q64 - 2 : 0;
#ifdef _MSC_VER
            aSig64 = 0ULL - ( ( bSig * q64 )<<38 );
#else
            aSig64 = - ( ( bSig * q64 )<<38 );
#endif
            expDiff -= 62;
        }
        expDiff += 64;
        q64 = estimateDiv128To64( aSig64, 0, bSig64 );
        q64 = ( 2 < q64 ) ? q64 - 2 : 0;
        q = q64>>( 64 - expDiff );
        bSig <<= 6;
        aSig = ( ( aSig64>>33 )<<( expDiff - 1 ) ) - bSig * q;
    }
    do {
        alternateASig = aSig;
        ++q;
        aSig -= bSig;
    } while ( 0 <= (int32_t) aSig );
    sigMean = aSig + alternateASig;
    if ( ( sigMean < 0 ) || ( ( sigMean == 0 ) && ( q & 1 ) ) ) {
        aSig = alternateASig;
    }
    zSign = ( (int32_t) aSig < 0 );
#ifdef _MSC_VER
    if ( zSign ) aSig = 0ULL - aSig;
#else
    if ( zSign ) aSig = - aSig;
#endif
    return normalizeRoundAndPackFloat32(aSign ^ zSign, bExp, aSig, status);
}